

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall
soul::heart::Parser::parseVariableAssignment
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder,AssignmentTarget *target)

{
  bool bVar1;
  int iVar2;
  Expression *source;
  undefined4 extraout_var;
  Expression *dest;
  pool_ptr<soul::heart::Expression> v;
  CodeLocation errorLocation;
  undefined1 local_78 [16];
  char *local_68;
  CompileMessage local_60;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x275da6);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"call");
  if (bVar1) {
    parseFunctionCall(this,state,builder,target);
    return;
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"read");
  if (bVar1) {
    parseReadStream(this,state,builder,target);
    return;
  }
  local_78._8_8_ =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if ((SourceCodeText *)local_78._8_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_78._8_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_78._8_8_)->super_RefCountedObject).refCount + 1;
  }
  local_68 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.location.data;
  source = parseExpression(this,state);
  iVar2 = (*(source->super_Object)._vptr_Object[2])(source);
  bVar1 = AssignmentTarget::checkType(target,(Type *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    expectSemicolon(this);
    (*(source->super_Object)._vptr_Object[2])(source);
    AssignmentTarget::create
              ((AssignmentTarget *)local_78,(FunctionParseState *)target,(FunctionBuilder *)state,
               (Type *)builder);
    if ((Expression *)local_78._0_8_ != (Expression *)0x0) {
      dest = pool_ptr<soul::heart::Expression>::operator*
                       ((pool_ptr<soul::heart::Expression> *)local_78);
      BlockBuilder::addAssignment(&builder->super_BlockBuilder,dest,source);
    }
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)(local_78 + 8));
    return;
  }
  Errors::incompatibleTargetType<>();
  CodeLocation::throwError((CodeLocation *)(local_78 + 8),&local_60);
}

Assistant:

void parseVariableAssignment (FunctionParseState& state, FunctionBuilder& builder, const AssignmentTarget& target)
    {
        expect (HEARTOperator::assign);

        if (matchIf ("call"))
            return parseFunctionCall (state, builder, target);

        if (matchIf ("read"))
            return parseReadStream (state, builder, target);

        auto errorLocation = location;
        auto& sourceValue = parseExpression (state);

        if (! target.checkType (sourceValue.getType()))
            errorLocation.throwError (Errors::incompatibleTargetType());

        expectSemicolon();

        if (auto v = target.create (state, builder, sourceValue.getType()))
            builder.addAssignment (*v, sourceValue);
    }